

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O2

void __thiscall SqlGenerator::generateLoadQuery(SqlGenerator *this)

{
  size_t sVar1;
  TDNode *__rhs;
  Attribute *pAVar2;
  ulong uVar3;
  string drop_views;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  ulong local_2f8;
  string load;
  string drop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream ofs;
  
  std::__cxx11::string::string((string *)&load,"",(allocator *)&ofs);
  std::__cxx11::string::string((string *)&drop,"",(allocator *)&ofs);
  local_2f8 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= local_2f8) break;
    __rhs = TreeDecomposition::getRelation
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,local_2f8);
    std::operator+(&drop_views,"DROP TABLE IF EXISTS ",&__rhs->_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                   &drop_views,";\n");
    std::__cxx11::string::append((string *)&drop);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&drop_views);
    std::operator+(&drop_views,"CREATE TABLE ",&__rhs->_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                   &drop_views,"(");
    std::__cxx11::string::append((string *)&load);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&drop_views);
    for (uVar3 = 0; uVar3 != 100; uVar3 = uVar3 + 1) {
      if (((__rhs->_bag).super__Base_bitset<2UL>._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
        pAVar2 = TreeDecomposition::getAttribute
                           ((this->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,uVar3);
        std::operator+(&local_318,&pAVar2->_name," ");
        typeToStr_abi_cxx11_(&local_290,this,pAVar2->_type);
        std::operator+(&drop_views,&local_318,&local_290);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                       &drop_views,",");
        std::__cxx11::string::append((string *)&load);
        std::__cxx11::string::~string((string *)&ofs);
        std::__cxx11::string::~string((string *)&drop_views);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_318);
      }
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::append((char *)&load);
    std::operator+(&local_250,"\\COPY ",&__rhs->_name);
    std::operator+(&local_270,&local_250," FROM \'");
    std::operator+(&local_2b0,&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   multifaq::dir::PATH_TO_DATA_abi_cxx11_);
    std::operator+(&local_290,&local_2b0,"/");
    std::operator+(&local_318,&local_290,&__rhs->_name);
    std::operator+(&drop_views,&local_318,".tbl\' ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                   &drop_views,"DELIMITER \'|\' CSV;\n");
    std::__cxx11::string::append((string *)&load);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&drop_views);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_250);
    local_2f8 = local_2f8 + 1;
  }
  std::operator+(&drop_views,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/load_data.sql");
  std::ofstream::ofstream(&ofs,(string *)&drop_views,_S_out);
  std::__cxx11::string::~string((string *)&drop_views);
  std::operator+(&drop_views,&drop,&load);
  std::operator<<((ostream *)&ofs,(string *)&drop_views);
  std::__cxx11::string::~string((string *)&drop_views);
  std::ofstream::close();
  std::__cxx11::string::string((string *)&drop_views,"",(allocator *)&local_318);
  uVar3 = 0;
  while( true ) {
    sVar1 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar1 <= uVar3) break;
    std::__cxx11::to_string(&local_2b0,uVar3);
    std::operator+(&local_290,"DROP TABLE IF EXISTS view_",&local_2b0);
    std::operator+(&local_318,&local_290,";\n");
    std::__cxx11::string::append((string *)&drop_views);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    uVar3 = uVar3 + 1;
  }
  std::operator+(&local_318,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/lmfao_cleanup.sql");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::operator<<((ostream *)&ofs,(string *)&drop_views);
  std::ofstream::close();
  std::operator+(&local_318,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/drop_data.sql");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::operator+(&local_318,&drop,&drop_views);
  std::operator<<((ostream *)&ofs,(string *)&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::ofstream::close();
  std::__cxx11::string::~string((string *)&drop_views);
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&drop);
  std::__cxx11::string::~string((string *)&load);
  return;
}

Assistant:

void SqlGenerator::generateLoadQuery()
{
    string load = "", drop = "";
    
    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
    {
        TDNode* rel = _td->getRelation(relID);
        const std::string& relName = rel->_name;

        drop += "DROP TABLE IF EXISTS "+relName+";\n";
        
        load += "CREATE TABLE "+relName+ "(";
        for (size_t var = 0; var < NUM_OF_VARIABLES; var++)
        {
            if (rel->_bag[var])
            {
                Attribute* att = _td->getAttribute(var);
                load += att->_name+" "+typeToStr(att->_type)+",";
            }
        }
        load.pop_back();
        load += ");\n";

        load += "\\COPY "+relName+" FROM \'"+multifaq::dir::PATH_TO_DATA+"/"+relName+".tbl\' "+
                "DELIMITER \'|\' CSV;\n";
    }

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/load_data.sql", std::ofstream::out);
    ofs << drop + load;
    ofs.close();
    // DINFO(drop + load);

    string drop_views = "";

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
        drop_views +=  "DROP TABLE IF EXISTS view_"+std::to_string(viewID)+";\n";

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/lmfao_cleanup.sql", std::ofstream::out);
    ofs << drop_views;
    ofs.close();
    
    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/drop_data.sql", std::ofstream::out);
    ofs << drop + drop_views;
    ofs.close();
}